

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::anon_unknown_0::convert_buffer_output
                 (char_t *param_1,uint8_t *r_u8,uint16_t *r_u16,uint32_t *r_u32,char_t *data,
                 size_t length,xml_encoding encoding)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  xml_encoding native_encoding_1;
  int in_stack_00000008;
  xml_encoding native_encoding;
  undefined8 local_8;
  
  if ((in_stack_00000008 == 3) || (in_stack_00000008 == 2)) {
    bVar1 = is_little_endian();
    iVar2 = 3;
    if (bVar1) {
      iVar2 = 2;
    }
    local_8 = (anonymous_namespace)::
              convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::utf16_writer>
                        (in_RDX,in_R8,in_R9,iVar2 != in_stack_00000008);
  }
  else if ((in_stack_00000008 == 6) || (in_stack_00000008 == 5)) {
    bVar1 = is_little_endian();
    iVar2 = 6;
    if (bVar1) {
      iVar2 = 5;
    }
    local_8 = (anonymous_namespace)::
              convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::utf32_writer>
                        (in_RCX,in_R8,in_R9,iVar2 != in_stack_00000008);
  }
  else if (in_stack_00000008 == 9) {
    local_8 = (anonymous_namespace)::
              convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::latin1_writer>
                        (in_RSI,in_R8,in_R9);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

PUGI__FN size_t convert_buffer_output(char_t* /* r_char */, uint8_t* r_u8, uint16_t* r_u16, uint32_t* r_u32, const char_t* data, size_t length, xml_encoding encoding)
	{
		if (encoding == encoding_utf16_be || encoding == encoding_utf16_le)
		{
			xml_encoding native_encoding = is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

			return convert_buffer_output_generic(r_u16, data, length, utf8_decoder(), utf16_writer(), native_encoding != encoding);
		}

		if (encoding == encoding_utf32_be || encoding == encoding_utf32_le)
		{
			xml_encoding native_encoding = is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

			return convert_buffer_output_generic(r_u32, data, length, utf8_decoder(), utf32_writer(), native_encoding != encoding);
		}

		if (encoding == encoding_latin1)
			return convert_buffer_output_generic(r_u8, data, length, utf8_decoder(), latin1_writer());

		assert(false && "Invalid encoding"); // unreachable
		return 0;
	}